

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

QByteArray * __thiscall
QSslSocketPrivate::peek(QByteArray *__return_storage_ptr__,QSslSocketPrivate *this,qint64 maxSize)

{
  Data *pDVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_88;
  QStringBuilder<QByteArray_&,_QByteArray> local_68;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->mode == UnencryptedMode) && (this->autoStartHandshake == false)) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char *)0x0;
    local_48.size = 0;
    QByteArray::reserve((QByteArray *)&local_48,maxSize);
    pcVar2 = QByteArray::data((QByteArray *)&local_48);
    QIODevicePrivate::QRingBufferRef::peek
              ((QRingBufferRef *)
               &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x90,pcVar2,
               maxSize,*(qint64 *)
                        &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x88);
    QByteArray::resize((longlong)&local_48);
    pcVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    if (maxSize == local_48.size) {
      local_48.d = (Data *)0x0;
      local_48.ptr = (char *)0x0;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = pcVar2;
      local_48.size = 0;
      (__return_storage_ptr__->d).size = maxSize;
    }
    else if (this->plainSocket == (QTcpSocket *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QIODevice::peek((longlong)&local_88);
      local_68.b.d.size = local_88.size;
      local_68.b.d.ptr = local_88.ptr;
      local_68.b.d.d = local_88.d;
      local_88.d = (Data *)0x0;
      local_88.ptr = (char *)0x0;
      local_88.size = 0;
      local_68.a = (QByteArray *)&local_48;
      QStringBuilder<QByteArray_&,_QByteArray>::convertTo<QByteArray>
                (__return_storage_ptr__,&local_68);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68.b.d);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00233f79;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_00233f79:
      __stack_chk_fail();
    }
    QIODevicePrivate::peek((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QSslSocketPrivate::peek(qint64 maxSize)
{
    if (mode == QSslSocket::UnencryptedMode && !autoStartHandshake) {
        //unencrypted mode - do not use QIODevice::peek, as it reads ahead data from the plain socket
        //peek at data already in the QIODevice buffer (from a previous read)
        QByteArray ret;
        ret.reserve(maxSize);
        ret.resize(buffer.peek(ret.data(), maxSize, transactionPos));
        if (ret.size() == maxSize)
            return ret;
        //peek at data in the plain socket
        if (plainSocket)
            return ret + plainSocket->peek(maxSize - ret.size());

        return QByteArray();
    } else {
        //encrypted mode - the socket engine will read and decrypt data into the QIODevice buffer
        return QTcpSocketPrivate::peek(maxSize);
    }
}